

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureFunctionTests.cpp
# Opt level: O0

bool vkt::sr::anon_unknown_0::functionHasAutoLod(ShaderType shaderType,Function function)

{
  undefined1 local_12;
  undefined1 local_11;
  Function function_local;
  ShaderType shaderType_local;
  
  local_11 = false;
  if (shaderType == SHADERTYPE_FRAGMENT) {
    local_12 = true;
    if (((function != FUNCTION_TEXTURE) && (local_12 = true, function != FUNCTION_TEXTUREPROJ)) &&
       (local_12 = true, function != FUNCTION_TEXTUREPROJ2)) {
      local_12 = function == FUNCTION_TEXTUREPROJ3;
    }
    local_11 = local_12;
  }
  return local_11;
}

Assistant:

inline bool functionHasAutoLod (glu::ShaderType shaderType, Function function)
{
	return shaderType == glu::SHADERTYPE_FRAGMENT &&
		   (function == FUNCTION_TEXTURE		||
			function == FUNCTION_TEXTUREPROJ	||
			function == FUNCTION_TEXTUREPROJ2	||
			function == FUNCTION_TEXTUREPROJ3);
}